

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LenEnc_Encode2
               (CLenPriceEnc *p,CRangeEnc *rc,UInt32 symbol,UInt32 posState,Bool updatePrice,
               UInt32 *ProbPrices)

{
  UInt32 UVar1;
  UInt32 *ProbPrices_local;
  Bool updatePrice_local;
  UInt32 posState_local;
  UInt32 symbol_local;
  CRangeEnc *rc_local;
  CLenPriceEnc *p_local;
  
  LenEnc_Encode(&p->p,rc,symbol,posState);
  if ((updatePrice != 0) &&
     (UVar1 = p->counters[posState] - 1, p->counters[posState] = UVar1, UVar1 == 0)) {
    LenPriceEnc_UpdateTable(p,posState,ProbPrices);
  }
  return;
}

Assistant:

static void LenEnc_Encode2(CLenPriceEnc* p, CRangeEnc* rc, UInt32 symbol, UInt32 posState, Bool updatePrice, UInt32* ProbPrices) {
  LenEnc_Encode(&p->p, rc, symbol, posState);
  if (updatePrice)
    if (--p->counters[posState] == 0)
      LenPriceEnc_UpdateTable(p, posState, ProbPrices);
}